

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cc
# Opt level: O2

void __thiscall
FIX::double_conversion::DoubleToStringConverter::CreateExponentialRepresentation
          (DoubleToStringConverter *this,char *decimal_digits,int length,int exponent,
          StringBuilder *result_builder)

{
  uint __line;
  long lVar1;
  long lVar2;
  char *__assertion;
  char buffer [6];
  
  if (length == 0) {
    __assertion = "length != 0";
    __line = 0x50;
  }
  else {
    StringBuilder::AddCharacter(result_builder,*decimal_digits);
    if (length != 1) {
      StringBuilder::AddCharacter(result_builder,'.');
      StringBuilder::AddSubstring(result_builder,decimal_digits + 1,length + -1);
    }
    StringBuilder::AddCharacter(result_builder,this->exponent_character_);
    if (exponent < 0) {
      StringBuilder::AddCharacter(result_builder,'-');
      exponent = -exponent;
    }
    else {
      if ((this->flags_ & 1) != 0) {
        StringBuilder::AddCharacter(result_builder,'+');
      }
      if (exponent == 0) {
        StringBuilder::AddCharacter(result_builder,'0');
        return;
      }
    }
    if ((uint)exponent < 10000) {
      buffer[5] = '\0';
      lVar2 = 0x500000000;
      lVar1 = 0;
      for (; 0 < exponent; exponent = (uint)exponent / 10) {
        buffer[lVar1 + 4] = (byte)((ulong)(uint)exponent % 10) | 0x30;
        lVar2 = lVar2 + -0x100000000;
        lVar1 = lVar1 + -1;
      }
      StringBuilder::AddSubstring(result_builder,buffer + (lVar2 >> 0x20),-(int)lVar1);
      return;
    }
    __assertion = "exponent < 1e4";
    __line = 99;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                ,__line,
                "void FIX::double_conversion::DoubleToStringConverter::CreateExponentialRepresentation(const char *, int, int, StringBuilder *) const"
               );
}

Assistant:

void DoubleToStringConverter::CreateExponentialRepresentation(
    const char* decimal_digits,
    int length,
    int exponent,
    StringBuilder* result_builder) const {
  ASSERT(length != 0);
  result_builder->AddCharacter(decimal_digits[0]);
  if (length != 1) {
    result_builder->AddCharacter('.');
    result_builder->AddSubstring(&decimal_digits[1], length-1);
  }
  result_builder->AddCharacter(exponent_character_);
  if (exponent < 0) {
    result_builder->AddCharacter('-');
    exponent = -exponent;
  } else {
    if ((flags_ & EMIT_POSITIVE_EXPONENT_SIGN) != 0) {
      result_builder->AddCharacter('+');
    }
  }
  if (exponent == 0) {
    result_builder->AddCharacter('0');
    return;
  }
  ASSERT(exponent < 1e4);
  const int kMaxExponentLength = 5;
  char buffer[kMaxExponentLength + 1];
  buffer[kMaxExponentLength] = '\0';
  int first_char_pos = kMaxExponentLength;
  while (exponent > 0) {
    buffer[--first_char_pos] = '0' + (exponent % 10);
    exponent /= 10;
  }
  result_builder->AddSubstring(&buffer[first_char_pos],
                               kMaxExponentLength - first_char_pos);
}